

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiddle~.c
# Opt level: O1

int sigfiddle_doinit(t_sigfiddle *x,long npoints,long npitch,long npeakanal,long npeakout)

{
  t_histopeak **pptVar1;
  int iVar2;
  long lVar3;
  t_peakout *__s;
  t_float *ptVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  
  lVar6 = 100;
  if (npeakanal < 100) {
    lVar6 = npeakanal;
  }
  if (lVar6 < 1) {
    lVar6 = 0;
  }
  lVar5 = 0x14;
  if (npeakanal != 0 || npeakout != 0) {
    lVar5 = lVar6;
  }
  lVar6 = 100;
  if (npeakout < 100) {
    lVar6 = npeakout;
  }
  lVar7 = 0;
  if (0 < lVar6) {
    lVar7 = lVar6;
  }
  lVar9 = 3;
  if (npitch < 3) {
    lVar9 = npitch;
  }
  if (lVar9 < 1) {
    lVar9 = 0;
  }
  lVar3 = 0x400;
  if (npoints != 0) {
    lVar3 = npoints;
  }
  iVar2 = sigfiddle_setnpoints(x,(float)lVar3);
  if (iVar2 == 0) {
    pd_error((void *)0x0,"fiddle~: out of memory");
    iVar2 = 0;
  }
  else {
    __s = (t_peakout *)getbytes(lVar7 * 8);
    if (__s == (t_peakout *)0x0) {
      sigfiddle_freebird(x);
      iVar2 = 0;
      pd_error((void *)0x0,"fiddle~: out of memory");
    }
    else {
      if (0 < npeakout) {
        memset(__s,0,lVar6 << 3);
      }
      x->x_peakbuf = __s;
      x->x_npeakout = (int)lVar7;
      x->x_npeakanal = (int)lVar5;
      x->x_phase = 0;
      x->x_histphase = 0;
      x->x_sr = 44100.0;
      ptVar4 = x->x_hist[0].h_pitches;
      lVar6 = 0;
      do {
        x->x_hist[lVar6].h_noted = 0.0;
        x->x_hist[lVar6].h_age = 0;
        x->x_hist[lVar6].h_pitch = 0.0;
        pptVar1 = &x->x_hist[lVar6].h_wherefrom;
        *pptVar1 = (t_histopeak *)0x0;
        pptVar1[1] = (t_histopeak *)0x0;
        lVar7 = -0x14;
        do {
          ptVar4[lVar7 + 0x14] = 0.0;
          ptVar4[lVar7] = 0.0;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0);
        lVar6 = lVar6 + 1;
        ptVar4 = ptVar4 + 0x30;
      } while (lVar6 != 3);
      iVar2 = 1;
      iVar8 = (int)lVar9;
      if (npitch < 1 && lVar5 != 0) {
        iVar8 = 1;
      }
      x->x_nprint = 0;
      x->x_npitch = iVar8;
      x->x_dbs[0] = 0.0;
      x->x_dbs[1] = 0.0;
      x->x_dbs[2] = 0.0;
      x->x_dbs[3] = 0.0;
      x->x_dbs[4] = 0.0;
      x->x_dbs[5] = 0.0;
      x->x_dbs[6] = 0.0;
      x->x_dbs[7] = 0.0;
      x->x_dbs[8] = 0.0;
      x->x_dbs[9] = 0.0;
      x->x_dbs[10] = 0.0;
      x->x_dbs[0xb] = 0.0;
      x->x_dbs[0xc] = 0.0;
      x->x_dbs[0xd] = 0.0;
      x->x_dbs[0xe] = 0.0;
      x->x_dbs[0xf] = 0.0;
      x->x_dbs[0x10] = 0.0;
      x->x_dbs[0x11] = 0.0;
      x->x_dbs[0x12] = 0.0;
      x->x_dbs[0x13] = 0.0;
      x->x_peaked = 0.0;
      x->x_dbage = 0;
      x->x_auto = 1;
      x->x_amplo = 40.0;
      x->x_amphi = 50.0;
      x->x_attacktime = 100;
      x->x_attackbins = 1;
      x->x_attackthresh = 10.0;
      x->x_vibtime = 0x32;
      x->x_vibbins = 1;
      x->x_vibdepth = 0.5;
      x->x_npartial = 7.0;
      x->x_attackvalue = 0;
    }
  }
  return iVar2;
}

Assistant:

int sigfiddle_doinit(t_sigfiddle *x, long npoints, long npitch,
    long npeakanal, long npeakout)
{
    t_float *buf1, *buf2,  *buf3;
    t_peakout *buf4;
    int i;

    if (!npeakanal && !npeakout) npeakanal = DEFNPEAK, npeakout = 0;
    if (npeakanal < 0) npeakanal = 0;
    else if (npeakanal > MAXPEAK) npeakanal = MAXPEAK;
    if (npeakout < 0) npeakout = 0;
    else if (npeakout > MAXPEAK) npeakout = MAXPEAK;
    if (npitch <= 0) npitch = 0;
    else if (npitch > MAXNPITCH) npitch = MAXNPITCH;
    if (npeakanal && !npitch) npitch = 1;
    if (!npoints)
        npoints = DEFAULTPOINTS;
    if (!sigfiddle_setnpoints(x, npoints))
    {
        pd_error(0, "fiddle~: out of memory");
        return (0);
    }
    if (!(buf4 = (t_peakout *)getbytes(sizeof(*buf4) * npeakout)))
    {
        sigfiddle_freebird(x);
        pd_error(0, "fiddle~: out of memory");
        return (0);
    }
    for (i = 0; i < npeakout; i++)
        buf4[i].po_freq = buf4[i].po_amp = 0;
    x->x_peakbuf = buf4;

    x->x_npeakout = (int)npeakout;
    x->x_npeakanal = (int)npeakanal;
    x->x_phase = 0;
    x->x_histphase = 0;
    x->x_sr = 44100;            /* this and the next are filled in later */
    for (i = 0; i < MAXNPITCH; i++)
    {
        int j;
        x->x_hist[i].h_pitch = x->x_hist[i].h_noted = 0;
        x->x_hist[i].h_age = 0;
        x->x_hist[i].h_wherefrom = 0;
        x->x_hist[i].h_outlet = 0;
        for (j = 0; j < HISTORY; j++)
            x->x_hist[i].h_amps[j] = x->x_hist[i].h_pitches[j] = 0;
    }
    x->x_nprint = 0;
    x->x_npitch = (int)npitch;
    for (i = 0; i < HISTORY; i++) x->x_dbs[i] = 0;
    x->x_dbage = 0;
    x->x_peaked = 0;
    x->x_auto = 1;
    x->x_amplo = DEFAMPLO;
    x->x_amphi = DEFAMPHI;
    x->x_attacktime = DEFATTACKTIME;
    x->x_attackbins = 1;                /* real value calculated afterward */
    x->x_attackthresh = DEFATTACKTHRESH;
    x->x_vibtime = DEFVIBTIME;
    x->x_vibbins = 1;                   /* real value calculated afterward */
    x->x_vibdepth = DEFVIBDEPTH;
    x->x_npartial = 7;
    x->x_attackvalue = 0;
    return (1);
}